

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O0

void hadamard_col8x2_avx2(__m256i *in,int iter)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  int in_ESI;
  undefined1 (*in_RDI) [32];
  __m256i b7;
  __m256i b6;
  __m256i b5;
  __m256i b4;
  __m256i b3;
  __m256i b2;
  __m256i b1;
  __m256i b0;
  __m256i a7;
  __m256i a6;
  __m256i a5;
  __m256i a4;
  __m256i a3;
  __m256i a2;
  __m256i a1;
  __m256i a0;
  
  uVar13 = *(undefined8 *)*in_RDI;
  uVar14 = *(undefined8 *)in_RDI[1];
  uVar15 = *(undefined8 *)in_RDI[2];
  uVar16 = *(undefined8 *)in_RDI[3];
  uVar17 = *(undefined8 *)in_RDI[4];
  uVar18 = *(undefined8 *)in_RDI[5];
  uVar19 = *(undefined8 *)in_RDI[6];
  uVar20 = *(undefined8 *)in_RDI[7];
  auVar8._8_8_ = uVar13;
  auVar8._0_8_ = uVar13;
  auVar8._16_8_ = uVar13;
  auVar8._24_8_ = uVar13;
  auVar1._8_8_ = uVar14;
  auVar1._0_8_ = uVar14;
  auVar1._16_8_ = uVar14;
  auVar1._24_8_ = uVar14;
  auVar1 = vpaddw_avx2(auVar8,auVar1);
  auVar24._8_8_ = uVar13;
  auVar24._0_8_ = uVar13;
  auVar24._16_8_ = uVar13;
  auVar24._24_8_ = uVar13;
  auVar23._8_8_ = uVar14;
  auVar23._0_8_ = uVar14;
  auVar23._16_8_ = uVar14;
  auVar23._24_8_ = uVar14;
  auVar8 = vpsubw_avx2(auVar24,auVar23);
  auVar9._8_8_ = uVar15;
  auVar9._0_8_ = uVar15;
  auVar9._16_8_ = uVar15;
  auVar9._24_8_ = uVar15;
  auVar2._8_8_ = uVar16;
  auVar2._0_8_ = uVar16;
  auVar2._16_8_ = uVar16;
  auVar2._24_8_ = uVar16;
  auVar2 = vpaddw_avx2(auVar9,auVar2);
  auVar22._8_8_ = uVar15;
  auVar22._0_8_ = uVar15;
  auVar22._16_8_ = uVar15;
  auVar22._24_8_ = uVar15;
  auVar21._8_8_ = uVar16;
  auVar21._0_8_ = uVar16;
  auVar21._16_8_ = uVar16;
  auVar21._24_8_ = uVar16;
  auVar9 = vpsubw_avx2(auVar22,auVar21);
  auVar6._8_8_ = uVar17;
  auVar6._0_8_ = uVar17;
  auVar6._16_8_ = uVar17;
  auVar6._24_8_ = uVar17;
  auVar3._8_8_ = uVar18;
  auVar3._0_8_ = uVar18;
  auVar3._16_8_ = uVar18;
  auVar3._24_8_ = uVar18;
  auVar3 = vpaddw_avx2(auVar6,auVar3);
  auVar7._8_8_ = uVar17;
  auVar7._0_8_ = uVar17;
  auVar7._16_8_ = uVar17;
  auVar7._24_8_ = uVar17;
  auVar10._8_8_ = uVar18;
  auVar10._0_8_ = uVar18;
  auVar10._16_8_ = uVar18;
  auVar10._24_8_ = uVar18;
  auVar10 = vpsubw_avx2(auVar7,auVar10);
  auVar5._8_8_ = uVar19;
  auVar5._0_8_ = uVar19;
  auVar5._16_8_ = uVar19;
  auVar5._24_8_ = uVar19;
  auVar4._8_8_ = uVar20;
  auVar4._0_8_ = uVar20;
  auVar4._16_8_ = uVar20;
  auVar4._24_8_ = uVar20;
  auVar4 = vpaddw_avx2(auVar5,auVar4);
  auVar12._8_8_ = uVar19;
  auVar12._0_8_ = uVar19;
  auVar12._16_8_ = uVar19;
  auVar12._24_8_ = uVar19;
  auVar11._8_8_ = uVar20;
  auVar11._0_8_ = uVar20;
  auVar11._16_8_ = uVar20;
  auVar11._24_8_ = uVar20;
  auVar11 = vpsubw_avx2(auVar12,auVar11);
  auVar5 = vpaddw_avx2(auVar1,auVar2);
  auVar6 = vpaddw_avx2(auVar8,auVar9);
  auVar12 = vpsubw_avx2(auVar1,auVar2);
  auVar8 = vpsubw_avx2(auVar8,auVar9);
  auVar1 = vpaddw_avx2(auVar3,auVar4);
  auVar2 = vpaddw_avx2(auVar10,auVar11);
  auVar3 = vpsubw_avx2(auVar3,auVar4);
  auVar4 = vpsubw_avx2(auVar10,auVar11);
  if (in_ESI == 0) {
    auVar9 = vpaddw_avx2(auVar5,auVar1);
    auVar10 = vpaddw_avx2(auVar6,auVar2);
    auVar11 = vpaddw_avx2(auVar12,auVar3);
    auVar7 = vpaddw_avx2(auVar8,auVar4);
    auVar1 = vpsubw_avx2(auVar5,auVar1);
    auVar2 = vpsubw_avx2(auVar6,auVar2);
    auVar3 = vpsubw_avx2(auVar12,auVar3);
    auVar4 = vpsubw_avx2(auVar8,auVar4);
    auVar5 = vpunpcklwd_avx2(auVar9,auVar3);
    auVar6 = vpunpcklwd_avx2(auVar1,auVar11);
    auVar3 = vpunpckhwd_avx2(auVar9,auVar3);
    auVar1 = vpunpckhwd_avx2(auVar1,auVar11);
    auVar8 = vpunpcklwd_avx2(auVar7,auVar4);
    auVar9 = vpunpcklwd_avx2(auVar2,auVar10);
    auVar4 = vpunpckhwd_avx2(auVar7,auVar4);
    auVar2 = vpunpckhwd_avx2(auVar2,auVar10);
    auVar10 = vpunpckldq_avx2(auVar5,auVar6);
    auVar11 = vpunpckldq_avx2(auVar8,auVar9);
    auVar5 = vpunpckhdq_avx2(auVar5,auVar6);
    auVar6 = vpunpckhdq_avx2(auVar8,auVar9);
    auVar8 = vpunpckldq_avx2(auVar3,auVar1);
    auVar9 = vpunpckldq_avx2(auVar4,auVar2);
    auVar1 = vpunpckhdq_avx2(auVar3,auVar1);
    auVar2 = vpunpckhdq_avx2(auVar4,auVar2);
    auVar3 = vpunpcklqdq_avx2(auVar10,auVar11);
    *in_RDI = auVar3;
    auVar3 = vpunpckhqdq_avx2(auVar10,auVar11);
    in_RDI[1] = auVar3;
    auVar3 = vpunpcklqdq_avx2(auVar5,auVar6);
    in_RDI[2] = auVar3;
    auVar3 = vpunpckhqdq_avx2(auVar5,auVar6);
    in_RDI[3] = auVar3;
    auVar3 = vpunpcklqdq_avx2(auVar8,auVar9);
    in_RDI[4] = auVar3;
    auVar3 = vpunpckhqdq_avx2(auVar8,auVar9);
    in_RDI[5] = auVar3;
    auVar3 = vpunpcklqdq_avx2(auVar1,auVar2);
    in_RDI[6] = auVar3;
    auVar1 = vpunpckhqdq_avx2(auVar1,auVar2);
    in_RDI[7] = auVar1;
  }
  else {
    auVar9 = vpaddw_avx2(auVar5,auVar1);
    *in_RDI = auVar9;
    auVar9 = vpaddw_avx2(auVar6,auVar2);
    in_RDI[7] = auVar9;
    auVar9 = vpaddw_avx2(auVar12,auVar3);
    in_RDI[3] = auVar9;
    auVar9 = vpaddw_avx2(auVar8,auVar4);
    in_RDI[4] = auVar9;
    auVar1 = vpsubw_avx2(auVar5,auVar1);
    in_RDI[2] = auVar1;
    auVar1 = vpsubw_avx2(auVar6,auVar2);
    in_RDI[6] = auVar1;
    auVar1 = vpsubw_avx2(auVar12,auVar3);
    in_RDI[1] = auVar1;
    auVar1 = vpsubw_avx2(auVar8,auVar4);
    in_RDI[5] = auVar1;
  }
  return;
}

Assistant:

static void hadamard_col8x2_avx2(__m256i *in, int iter) {
  __m256i a0 = in[0];
  __m256i a1 = in[1];
  __m256i a2 = in[2];
  __m256i a3 = in[3];
  __m256i a4 = in[4];
  __m256i a5 = in[5];
  __m256i a6 = in[6];
  __m256i a7 = in[7];

  __m256i b0 = _mm256_add_epi16(a0, a1);
  __m256i b1 = _mm256_sub_epi16(a0, a1);
  __m256i b2 = _mm256_add_epi16(a2, a3);
  __m256i b3 = _mm256_sub_epi16(a2, a3);
  __m256i b4 = _mm256_add_epi16(a4, a5);
  __m256i b5 = _mm256_sub_epi16(a4, a5);
  __m256i b6 = _mm256_add_epi16(a6, a7);
  __m256i b7 = _mm256_sub_epi16(a6, a7);

  a0 = _mm256_add_epi16(b0, b2);
  a1 = _mm256_add_epi16(b1, b3);
  a2 = _mm256_sub_epi16(b0, b2);
  a3 = _mm256_sub_epi16(b1, b3);
  a4 = _mm256_add_epi16(b4, b6);
  a5 = _mm256_add_epi16(b5, b7);
  a6 = _mm256_sub_epi16(b4, b6);
  a7 = _mm256_sub_epi16(b5, b7);

  if (iter == 0) {
    b0 = _mm256_add_epi16(a0, a4);
    b7 = _mm256_add_epi16(a1, a5);
    b3 = _mm256_add_epi16(a2, a6);
    b4 = _mm256_add_epi16(a3, a7);
    b2 = _mm256_sub_epi16(a0, a4);
    b6 = _mm256_sub_epi16(a1, a5);
    b1 = _mm256_sub_epi16(a2, a6);
    b5 = _mm256_sub_epi16(a3, a7);

    a0 = _mm256_unpacklo_epi16(b0, b1);
    a1 = _mm256_unpacklo_epi16(b2, b3);
    a2 = _mm256_unpackhi_epi16(b0, b1);
    a3 = _mm256_unpackhi_epi16(b2, b3);
    a4 = _mm256_unpacklo_epi16(b4, b5);
    a5 = _mm256_unpacklo_epi16(b6, b7);
    a6 = _mm256_unpackhi_epi16(b4, b5);
    a7 = _mm256_unpackhi_epi16(b6, b7);

    b0 = _mm256_unpacklo_epi32(a0, a1);
    b1 = _mm256_unpacklo_epi32(a4, a5);
    b2 = _mm256_unpackhi_epi32(a0, a1);
    b3 = _mm256_unpackhi_epi32(a4, a5);
    b4 = _mm256_unpacklo_epi32(a2, a3);
    b5 = _mm256_unpacklo_epi32(a6, a7);
    b6 = _mm256_unpackhi_epi32(a2, a3);
    b7 = _mm256_unpackhi_epi32(a6, a7);

    in[0] = _mm256_unpacklo_epi64(b0, b1);
    in[1] = _mm256_unpackhi_epi64(b0, b1);
    in[2] = _mm256_unpacklo_epi64(b2, b3);
    in[3] = _mm256_unpackhi_epi64(b2, b3);
    in[4] = _mm256_unpacklo_epi64(b4, b5);
    in[5] = _mm256_unpackhi_epi64(b4, b5);
    in[6] = _mm256_unpacklo_epi64(b6, b7);
    in[7] = _mm256_unpackhi_epi64(b6, b7);
  } else {
    in[0] = _mm256_add_epi16(a0, a4);
    in[7] = _mm256_add_epi16(a1, a5);
    in[3] = _mm256_add_epi16(a2, a6);
    in[4] = _mm256_add_epi16(a3, a7);
    in[2] = _mm256_sub_epi16(a0, a4);
    in[6] = _mm256_sub_epi16(a1, a5);
    in[1] = _mm256_sub_epi16(a2, a6);
    in[5] = _mm256_sub_epi16(a3, a7);
  }
}